

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O2

void __thiscall
sentencepiece::normalizer::Normalizer::Normalizer
          (Normalizer *this,NormalizerSpec *spec,TrainerSpec *trainer_spec)

{
  this->_vptr_Normalizer = (_func_int **)&PTR__Normalizer_003b7690;
  (this->trie_)._M_t.
  super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
  .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>._M_head_impl =
       (DoubleArrayImpl<void,_void,_int,_void> *)0x0;
  this->normalized_ = (char *)0x0;
  this->spec_ = spec;
  this->matcher_ = (PrefixMatcher *)0x0;
  this->treat_whitespace_as_suffix_ = trainer_spec->treat_whitespace_as_suffix_;
  util::Status::Status(&this->status_);
  Init(this);
  return;
}

Assistant:

Normalizer::Normalizer(const NormalizerSpec &spec,
                       const TrainerSpec &trainer_spec)
    : spec_(&spec),
      treat_whitespace_as_suffix_(trainer_spec.treat_whitespace_as_suffix()),
      status_(util::OkStatus()) {
  Init();
}